

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree-inl.hh
# Opt level: O1

Iterator * __thiscall
phosg::KDTree<phosg::Vector2<long>,_long>::insert
          (Iterator *__return_storage_ptr__,KDTree<phosg::Vector2<long>,_long> *this,
          Vector2<long> *pt,long *v)

{
  anon_union_8_2_94730038_for_Vector2<long>_3 aVar1;
  Node *new_node;
  
  new_node = (Node *)operator_new(0x38);
  aVar1 = pt->field_1;
  (new_node->pt).field_0 = pt->field_0;
  (new_node->pt).field_1 = aVar1;
  new_node->after_or_equal = (Node *)0x0;
  new_node->parent = (Node *)0x0;
  new_node->dim = 0;
  new_node->before = (Node *)0x0;
  new_node->value = *v;
  link_node(this,new_node);
  Iterator::Iterator(__return_storage_ptr__,new_node);
  return __return_storage_ptr__;
}

Assistant:

typename KDTree<CoordType, ValueType>::Iterator
KDTree<CoordType, ValueType>::insert(const CoordType& pt, const ValueType& v) {
  Node* n = new Node(pt, v);
  this->link_node(n);
  return Iterator(n);
}